

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

int nghttp3_qpack_encoder_block_stream(nghttp3_qpack_encoder *encoder,nghttp3_qpack_stream *stream)

{
  int iVar1;
  nghttp3_blocked_streams_key bsk;
  nghttp3_ksl *in_stack_00000028;
  
  nghttp3_pq_top((nghttp3_pq *)0x10d87c);
  iVar1 = nghttp3_ksl_insert(in_stack_00000028,(nghttp3_ksl_it *)encoder,stream,(void *)bsk.id);
  return iVar1;
}

Assistant:

int nghttp3_qpack_encoder_block_stream(nghttp3_qpack_encoder *encoder,
                                       nghttp3_qpack_stream *stream) {
  nghttp3_blocked_streams_key bsk = {
    .max_cnt = nghttp3_struct_of(nghttp3_pq_top(&stream->max_cnts),
                                 nghttp3_qpack_header_block_ref, max_cnts_pe)
                 ->max_cnt,
    .id = (uint64_t)stream->stream_id,
  };

  return nghttp3_ksl_insert(&encoder->blocked_streams, NULL, &bsk, stream);
}